

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pragma_version.cpp
# Opt level: O2

void duckdb::PragmaPlatform::RegisterFunction(BuiltinFunctions *set)

{
  TableFunction pragma_platform;
  allocator local_3b9;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_3b8;
  string local_398;
  TableFunction local_378;
  TableFunction local_1c0;
  
  ::std::__cxx11::string::string((string *)&local_398,"pragma_platform",&local_3b9);
  local_3b8.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_3b8.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3b8.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  TableFunction::TableFunction
            (&local_1c0,&local_398,(vector<duckdb::LogicalType,_true> *)&local_3b8,
             PragmaPlatformFunction,(table_function_bind_t)0x0,(table_function_init_global_t)0x0,
             (table_function_init_local_t)0x0);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_3b8);
  ::std::__cxx11::string::~string((string *)&local_398);
  local_1c0.bind = PragmaPlatformBind;
  local_1c0.init_global = PragmaPlatformInit;
  TableFunction::TableFunction(&local_378,&local_1c0);
  BuiltinFunctions::AddFunction(set,&local_378);
  TableFunction::~TableFunction(&local_378);
  TableFunction::~TableFunction(&local_1c0);
  return;
}

Assistant:

void PragmaPlatform::RegisterFunction(BuiltinFunctions &set) {
	TableFunction pragma_platform("pragma_platform", {}, PragmaPlatformFunction);
	pragma_platform.bind = PragmaPlatformBind;
	pragma_platform.init_global = PragmaPlatformInit;
	set.AddFunction(pragma_platform);
}